

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar3;
  double *pdVar4;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar5;
  uint uVar6;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_> *pFVar7
  ;
  ulong uVar8;
  value_type vVar9;
  
  pFVar7 = (fadexpr->fadexpr_).left_;
  pFVar5 = (pFVar7->fadexpr_).right_;
  uVar6 = (((pFVar5->fadexpr_).left_)->dx_).num_elts;
  uVar1 = (((pFVar5->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 < (int)uVar6) {
    uVar1 = uVar6;
  }
  uVar2 = (((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 <= (int)uVar2) {
    uVar1 = uVar2;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00dc05f3;
    pdVar4 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar4 = (this->dx_).ptr_to_data;
        if (pdVar4 != (double *)0x0) {
          operator_delete__(pdVar4);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00dc05f3;
    }
    if (uVar2 != 0) {
      pdVar4 = (this->dx_).ptr_to_data;
      if (pdVar4 != (double *)0x0) {
        operator_delete__(pdVar4);
        pFVar7 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar8 = (ulong)uVar1 << 3;
    }
    pdVar4 = (double *)operator_new__(uVar8);
    (this->dx_).ptr_to_data = pdVar4;
    pFVar5 = (pFVar7->fadexpr_).right_;
    uVar6 = (((pFVar5->fadexpr_).left_)->dx_).num_elts;
  }
  if (((uVar6 == 0) || ((((pFVar5->fadexpr_).right_)->dx_).num_elts == 0)) ||
     ((((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts == 0)) {
    if (0 < (int)uVar1) {
      uVar8 = 0;
      do {
        vVar9 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
                ::dx(&fadexpr->fadexpr_,(int)uVar8);
        pdVar4[uVar8] = vVar9;
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
  }
  else if (0 < (int)uVar1) {
    uVar8 = 0;
    do {
      vVar9 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
              ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar8);
      pdVar4[uVar8] = vVar9;
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
LAB_00dc05f3:
  pFVar7 = (fadexpr->fadexpr_).left_;
  pFVar3 = (fadexpr->fadexpr_).right_;
  pFVar5 = (pFVar7->fadexpr_).right_;
  this->val_ = ((double)(pFVar3->fadexpr_).left_.constant_ + ((pFVar3->fadexpr_).right_)->val_) *
               (((pFVar5->fadexpr_).left_)->val_ + ((pFVar5->fadexpr_).right_)->val_) *
               (pFVar7->fadexpr_).left_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}